

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  pointer *ppbVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  NoTests NVar6;
  ostream *poVar7;
  size_type sVar8;
  size_type sVar9;
  reference pbVar10;
  iterator __first;
  reference __x;
  char *pcVar11;
  string_view str;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a18;
  cmDuration local_a10;
  cmDuration durationInSecs;
  cmCTestTestResult *ft;
  iterator __end2;
  iterator __begin2;
  SetOfTests *__range2;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  undefined1 local_9b0 [8];
  SetOfTests resultsSet;
  undefined1 local_960 [8];
  ostringstream cmCTestLog_msg_3;
  string *j;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ostringstream local_7a8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_630 [32];
  undefined1 local_610 [8];
  ostringstream cmCTestLog_msg_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_490;
  bool noTestsFoundError;
  time_point clock_finish;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_480;
  time_point clock_start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  cmGeneratedFileStream mLogFile;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestTestHandler *this_local;
  
  bVar3 = ProcessOptions(this);
  if (bVar3) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::clear(&this->TestResults);
    std::__cxx11::ostringstream::ostringstream(local_190);
    pcVar11 = "Test";
    if ((this->MemCheck & 1U) != 0) {
      pcVar11 = "Memory check";
    }
    poVar7 = std::operator<<((ostream *)local_190,pcVar11);
    poVar7 = std::operator<<(poVar7," project ");
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,local_1c0);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1c0);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x1a0,pcVar11,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&mLogFile.field_0x260);
    std::__cxx11::ostringstream::~ostringstream(local_190);
    iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])();
    if (iVar5 == 0) {
      this_local._4_4_ = -1;
    }
    else {
      ppbVar1 = &passed.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)ppbVar1,None);
      pcVar11 = "Test";
      if ((this->MemCheck & 1U) != 0) {
        pcVar11 = "DynamicAnalysis";
      }
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,pcVar11,(cmGeneratedFileStream *)ppbVar1);
      this->LogFile =
           (ostream *)
           &passed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppbVar1 = &failed.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&clock_start);
      local_480.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      bVar3 = ProcessDirectory(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)ppbVar1,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&clock_start);
      if (bVar3) {
        tStack_490.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar3 = false;
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&failed.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&clock_start);
        if (sVar8 + sVar9 == 0) {
          bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
          if (((!bVar4) &&
              (bVar4 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest), !bVar4
              )) && (NVar6 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest),
                    NVar6 != Ignore)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            poVar7 = std::operator<<((ostream *)local_610,"No tests were found!!!");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar11 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x1ba,pcVar11,false);
            std::__cxx11::string::~string(local_630);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
            NVar6 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest);
            bVar3 = NVar6 == Error;
          }
        }
        else {
          if ((((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE) &&
              (bVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&failed.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) &&
             (((this->UseIncludeRegExpFlag & 1U) != 0 || ((this->UseExcludeRegExpFlag & 1U) != 0))))
          {
            std::__cxx11::ostringstream::ostringstream(local_7a8);
            poVar7 = (ostream *)
                     std::ostream::operator<<(local_7a8,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,"The following tests passed:");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar11 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x1c5,pcVar11,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)&__range3);
            std::__cxx11::ostringstream::~ostringstream(local_7a8);
            ppbVar1 = &failed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)ppbVar1);
            j = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppbVar1);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&j), bVar4) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end3);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_960);
              poVar7 = std::operator<<((ostream *)local_960,"\t");
              poVar7 = std::operator<<(poVar7,(string *)pbVar10);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar11 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar2,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                           ,0x1c8,pcVar11,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string
                        ((string *)&resultsSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_960);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
          }
          __first = std::
                    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    ::begin(&this->TestResults);
          disabledTests.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                        ::end(&this->TestResults);
          std::
          set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
          ::
          set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
                    ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                      *)local_9b0,
                     (__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                      )__first._M_current,
                     (__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                      )disabledTests.
                       super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::vector((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    *)&__range2);
          __end2 = std::
                   set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                   ::begin((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                            *)local_9b0);
          ft = (cmCTestTestResult *)
               std::
               set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ::end((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                      *)local_9b0);
          while (bVar4 = std::operator!=(&__end2,(_Self *)&ft), bVar4) {
            __x = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator*
                            (&__end2);
            str = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&__x->CompletionStatus);
            durationInSecs.__r = (rep_conflict)str._M_len;
            bVar4 = cmHasLiteralPrefix<6ul>(str,(char (*) [6])"SKIP_");
            if ((bVar4) || (bVar4 = std::operator==(&__x->CompletionStatus,"Disabled"), bVar4)) {
              std::
              vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ::push_back((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                           *)&__range2,__x);
            }
            std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator++(&__end2)
            ;
          }
          local_a18.__r = (rep)std::chrono::operator-(&stack0xfffffffffffffb70,&local_480);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_a10,&local_a18);
          LogTestSummary(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&failed.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&clock_start,&local_a10);
          LogDisabledTests(this,(vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                 *)&__range2);
          LogFailedTests(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&clock_start,(SetOfTests *)local_9b0);
          std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~vector((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     *)&__range2);
          std::
          set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~set((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  *)local_9b0);
        }
        bVar4 = GenerateXML(this);
        if (bVar4) {
          bVar4 = WriteJUnitXML(this);
          if (bVar4) {
            iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])();
            if (iVar5 == 0) {
              this->LogFile = (ostream *)0x0;
              this_local._4_4_ = -1;
            }
            else {
              bVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&clock_start);
              if (bVar4) {
                if (bVar3) {
                  this->LogFile = (ostream *)0x0;
                  this_local._4_4_ = -1;
                }
                else {
                  this->LogFile = (ostream *)0x0;
                  this_local._4_4_ = 0;
                }
              }
              else {
                this->LogFile = (ostream *)0x0;
                this_local._4_4_ = -1;
              }
            }
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      clock_finish.__d.__r._4_4_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&clock_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&failed.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmGeneratedFileStream::~cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &passed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  if (!this->ProcessOptions()) {
    return -1;
  }

  this->TestResults.clear();

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     (this->MemCheck ? "Memory check" : "Test")
                       << " project "
                       << cmSystemTools::GetCurrentWorkingDirectory()
                       << std::endl,
                     this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;

  // start the real time clock
  auto clock_start = std::chrono::steady_clock::now();

  if (!this->ProcessDirectory(passed, failed)) {
    return -1;
  }

  auto clock_finish = std::chrono::steady_clock::now();

  bool noTestsFoundError = false;
  if (passed.size() + failed.size() == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() &&
        this->CTest->GetNoTestsMode() != cmCTest::NoTests::Ignore) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No tests were found!!!" << std::endl);
      if (this->CTest->GetNoTestsMode() == cmCTest::NoTests::Error) {
        noTestsFoundError = true;
      }
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::string const& j : passed) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << j << std::endl, this->Quiet);
      }
    }

    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (cmCTestTestResult const& ft : resultsSet) {
      if (cmHasLiteralPrefix(ft.CompletionStatus, "SKIP_") ||
          ft.CompletionStatus == "Disabled") {
        disabledTests.push_back(ft);
      }
    }

    cmDuration durationInSecs = clock_finish - clock_start;
    this->LogTestSummary(passed, failed, durationInSecs);

    this->LogDisabledTests(disabledTests);

    this->LogFailedTests(failed, resultsSet);
  }

  if (!this->GenerateXML()) {
    return 1;
  }

  if (!this->WriteJUnitXML()) {
    return 1;
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (noTestsFoundError) {
    this->LogFile = nullptr;
    return -1;
  }

  this->LogFile = nullptr;
  return 0;
}